

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermNode * __thiscall
glslang::HlslParseContext::transformEntryPoint
          (HlslParseContext *this,TSourceLoc *loc,TFunction *userFunction,TAttributes *attributes)

{
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  TIntermediate *pTVar1;
  TIntermediate *pTVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  TBuiltInVariable TVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *pcVar8;
  undefined4 extraout_var_05;
  HlslParseContext *this_01;
  TString *pTVar9;
  undefined4 extraout_var_06;
  TIntermAggregate *this_02;
  undefined4 extraout_var_07;
  reference ppTVar10;
  undefined4 extraout_var_08;
  TQualifier *pTVar11;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long lVar12;
  TIntermAggregate *pTVar13;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  TIntermTyped *pTVar14;
  TIntermTyped *pTVar15;
  reference ppTVar16;
  TIntermSymbol *pTVar17;
  undefined4 extraout_var_14;
  TVariable *variable_00;
  undefined4 extraout_var_15;
  TType *pTVar18;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  TIntermSymbol *right;
  size_t s;
  HlslParseContext *local_780;
  TIntermNode *synthFunctionDef;
  TParameter *local_770;
  TParameter *local_768;
  iterator iStack_760;
  int i_2;
  iterator outputIt;
  TType derefElementType;
  TIntermTyped *element;
  TVariable *variable;
  TString *invocationIdName;
  TType invocationIdType;
  TIntermSymbol *invocationIdSym;
  TIntermTyped *returnAssign;
  TIntermTyped *callReturn;
  TType local_5f0;
  TIntermAggregate *local_558;
  TIntermTyped *local_550;
  TIntermAggregate *local_548;
  TIntermAggregate *dst;
  TIntermTyped *recip_w;
  TIntermConstantUnion *one;
  TString local_528;
  TIntermTyped *local_500;
  TIntermTyped *pos_w;
  TString local_4f0;
  TIntermTyped *local_4c8;
  TIntermTyped *pos_xyz;
  TIntermTyped *input;
  TIntermSymbol *arg;
  TParameter *local_4a8;
  TParameter *param;
  TIntermTyped *pTStack_498;
  int i_1;
  TIntermTyped *callingArgs;
  iterator opaqueUniformIt;
  iterator inputIt;
  TIntermAggregate *synthBody;
  TVector<glslang::TVariable_*> argVars;
  TFunction callee;
  TIntermAggregate *synthParams;
  TFunction synthEntryPoint;
  TType voidType;
  TVariable *var;
  TString *paramName;
  TType *paramType;
  undefined1 local_d8 [4];
  int i;
  TVector<glslang::TVariable_*> opaque_uniforms;
  __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
  local_b0;
  iterator it_2;
  __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
  local_a0;
  iterator it_1;
  __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
  local_90;
  iterator it;
  anon_class_8_1_8991fb9c makeVariableInOut;
  TVector<glslang::TVariable_*> outputs;
  TVector<glslang::TVariable_*> inputs;
  TVariable *entryPointOutput;
  anon_class_8_1_8991fb9c isDsPcfInput;
  TAttributes *attributes_local;
  TFunction *userFunction_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  entryPointOutput = (TVariable *)this;
  isDsPcfInput.this = (HlslParseContext *)attributes;
  iVar4 = (*(userFunction->super_TSymbol)._vptr_TSymbol[3])();
  bVar3 = isEntrypointName(this,(TString *)CONCAT44(extraout_var,iVar4));
  if (bVar3) {
    this->entryPointFunction = userFunction;
    handleEntryPointAttributes(this,loc,(TAttributes *)isDsPcfInput.this);
    TVector<glslang::TVariable_*>::TVector
              ((TVector<glslang::TVariable_*> *)
               &outputs.
                super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
                super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    TVector<glslang::TVariable_*>::TVector((TVector<glslang::TVariable_*> *)&makeVariableInOut);
    remapEntryPointIO(this,userFunction,
                      (TVariable **)
                      &inputs.
                       super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                       .
                       super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (TVector<glslang::TVariable_*> *)
                      &outputs.
                       super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                       .
                       super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (TVector<glslang::TVariable_*> *)&makeVariableInOut);
    it._M_current = (TVariable **)this;
    if (inputs.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      transformEntryPoint::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&it,
                 (TVariable *)
                 inputs.
                 super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
                 super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    local_90._M_current =
         (TVariable **)
         std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::begin
                   ((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_> *)
                    &outputs.
                     super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                     .
                     super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    while( true ) {
      it_1 = std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::end
                       ((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                         *)&outputs.
                            super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                            .
                            super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=(&local_90,&it_1);
      if (!bVar3) break;
      ppTVar16 = __gnu_cxx::
                 __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                 ::operator*(&local_90);
      iVar4 = (*((*ppTVar16)->super_TSymbol)._vptr_TSymbol[0xc])();
      bVar3 = transformEntryPoint::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)&entryPointOutput,
                         (TType *)CONCAT44(extraout_var_00,iVar4));
      if (!bVar3) {
        ppTVar16 = __gnu_cxx::
                   __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                   ::operator*(&local_90);
        transformEntryPoint::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)&it,*ppTVar16);
      }
      __gnu_cxx::
      __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
      ::operator++(&local_90);
    }
    local_a0._M_current =
         (TVariable **)
         std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::begin
                   ((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_> *)
                    &makeVariableInOut);
    while( true ) {
      it_2 = std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::end
                       ((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                         *)&makeVariableInOut);
      bVar3 = __gnu_cxx::operator!=(&local_a0,&it_2);
      if (!bVar3) break;
      ppTVar16 = __gnu_cxx::
                 __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                 ::operator*(&local_a0);
      transformEntryPoint::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&it,*ppTVar16);
      __gnu_cxx::
      __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
      ::operator++(&local_a0);
    }
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation) {
      local_b0._M_current =
           (TVariable **)
           std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::begin
                     ((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                       *)&outputs.
                          super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                          .
                          super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        opaque_uniforms.
        super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::
                      end((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                           *)&outputs.
                              super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                              .
                              super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar3 = __gnu_cxx::operator!=
                          (&local_b0,
                           (__normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                            *)&opaque_uniforms.
                               super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                               .
                               super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar3) break;
        ppTVar16 = __gnu_cxx::
                   __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                   ::operator*(&local_b0);
        iVar4 = (*((*ppTVar16)->super_TSymbol)._vptr_TSymbol[0xc])();
        bVar3 = transformEntryPoint::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)&entryPointOutput,
                           (TType *)CONCAT44(extraout_var_01,iVar4));
        if (bVar3) {
          ppTVar16 = __gnu_cxx::
                     __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                     ::operator*(&local_b0);
          transformEntryPoint::anon_class_8_1_8991fb9c::operator()
                    ((anon_class_8_1_8991fb9c *)&it,*ppTVar16);
        }
        __gnu_cxx::
        __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
        ::operator++(&local_b0);
      }
    }
    TVector<glslang::TVariable_*>::TVector((TVector<glslang::TVariable_*> *)local_d8);
    for (paramType._4_4_ = 0; iVar4 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])(),
        (int)paramType._4_4_ < iVar4; paramType._4_4_ = paramType._4_4_ + 1) {
      iVar4 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])
                        (userFunction,(ulong)paramType._4_4_);
      pTVar18 = *(TType **)(CONCAT44(extraout_var_02,iVar4) + 8);
      iVar4 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])
                        (userFunction,(ulong)paramType._4_4_);
      this_00 = *(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> **)
                 CONCAT44(extraout_var_03,iVar4);
      iVar4 = (*pTVar18->_vptr_TType[10])();
      if (((uint)*(undefined8 *)(CONCAT44(extraout_var_04,iVar4) + 8) & 0x7f) == 5) {
        uVar5 = (*pTVar18->_vptr_TType[0x36])();
        if ((uVar5 & 1) == 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x40])
                    (this,loc,pTVar18,this_00,0);
        }
        else {
          pcVar8 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                             (this_00);
          voidType.spirvType = (TSpirvType *)makeInternalVariable(this,pcVar8,pTVar18);
          std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::
          push_back((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_> *)
                    local_d8,(value_type *)&voidType.spirvType);
        }
      }
    }
    pushScope(this);
    TType::TType((TType *)&synthEntryPoint.linkType,EbtVoid,EvqTemporary,1,0,0,false);
    iVar4 = (*(userFunction->super_TSymbol)._vptr_TSymbol[3])();
    pTVar9 = (TString *)CONCAT44(extraout_var_05,iVar4);
    TFunction::TFunction
              ((TFunction *)&synthParams,pTVar9,(TType *)&synthEntryPoint.linkType,EOpNull);
    this_01 = (HlslParseContext *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)pTVar9);
    TIntermAggregate::TIntermAggregate((TIntermAggregate *)this_01);
    TIntermediate::setAggregateOperator
              ((this->super_TParseContextBase).super_TParseVersions.intermediate,
               (TIntermNode *)this_01,EOpParameters,(TType *)&synthEntryPoint.linkType,loc);
    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar9 = TFunction::getMangledName_abi_cxx11_((TFunction *)&synthParams);
    pcVar8 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (pTVar9);
    TIntermediate::setEntryPointMangledName(pTVar1,pcVar8);
    TIntermediate::incrementEntryPointCount
              ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    iVar4 = (*(userFunction->super_TSymbol)._vptr_TSymbol[3])();
    TFunction::TFunction
              ((TFunction *)
               &argVars.
                super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
                super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (TString *)CONCAT44(extraout_var_06,iVar4),(TType *)&synthEntryPoint.linkType,EOpNull
              );
    pcVar8 = "@";
    (*(userFunction->super_TSymbol)._vptr_TSymbol[5])();
    TVector<glslang::TVariable_*>::TVector((TVector<glslang::TVariable_*> *)&synthBody);
    this_02 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)pcVar8);
    TIntermAggregate::TIntermAggregate(this_02);
    opaqueUniformIt =
         std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::begin
                   ((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_> *)
                    &outputs.
                     super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                     .
                     super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    callingArgs = (TIntermTyped *)
                  std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                  ::begin((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                           *)local_d8);
    pTStack_498 = (TIntermTyped *)0x0;
    for (param._4_4_ = 0; uVar5 = param._4_4_,
        iVar4 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])(), (int)uVar5 < iVar4;
        param._4_4_ = param._4_4_ + 1) {
      iVar4 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])(userFunction,(ulong)param._4_4_);
      local_4a8 = (TParameter *)CONCAT44(extraout_var_07,iVar4);
      arg = (TIntermSymbol *)makeInternalVariable(this,local_4a8->name,local_4a8->type);
      std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::push_back
                ((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_> *)
                 &synthBody,(value_type *)&arg);
      ppTVar10 = std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::
                 back((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                       *)&synthBody);
      iVar4 = (*((*ppTVar10)->super_TSymbol)._vptr_TSymbol[0xd])();
      pTVar11 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x50))();
      TQualifier::makeTemporary(pTVar11);
      TVar6 = TParameter::getDeclaredBuiltIn(local_4a8);
      if (TVar6 == EbvInputPatch) {
        ppTVar10 = std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                   ::back((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                           *)&synthBody);
        this->inputPatch = *ppTVar10;
      }
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      ppTVar10 = std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::
                 back((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                       *)&synthBody);
      input = &TIntermediate::addSymbol(pTVar1,*ppTVar10)->super_TIntermTyped;
      handleFunctionArgument
                (this,(TFunction *)
                      &argVars.
                       super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                       .
                       super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffb68,
                 input);
      iVar4 = (*local_4a8->type->_vptr_TType[10])();
      bVar3 = TQualifier::isParamInput((TQualifier *)CONCAT44(extraout_var_09,iVar4));
      if (bVar3) {
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        ppTVar16 = __gnu_cxx::
                   __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                   ::operator*(&opaqueUniformIt);
        pos_xyz = &TIntermediate::addSymbol(pTVar1,*ppTVar16)->super_TIntermTyped;
        iVar4 = (*(((TIntermSymbol *)pos_xyz)->super_TIntermTyped).super_TIntermNode.
                  _vptr_TIntermNode[0x1e])();
        lVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar4) + 0x58))();
        if ((((uint)(*(ulong *)(lVar12 + 8) >> 7) & 0x1ff) == 0x3f) &&
           (bVar3 = TIntermediate::getDxPositionW
                              ((this->super_TParseContextBase).super_TParseVersions.intermediate),
           pTVar15 = pos_xyz, bVar3)) {
          pool_allocator<char>::pool_allocator((pool_allocator<char> *)&pos_w);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_4f0,"xyz",(pool_allocator<char> *)&pos_w);
          pTVar14 = handleDotDereference(this,loc,pTVar15,&local_4f0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_4f0);
          pTVar15 = pos_xyz;
          local_4c8 = pTVar14;
          pool_allocator<char>::pool_allocator((pool_allocator<char> *)&one);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &local_528,"w",(pool_allocator<char> *)&one);
          pTVar15 = handleDotDereference(this,loc,pTVar15,&local_528);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string(&local_528);
          local_500 = pTVar15;
          recip_w = &TIntermediate::addConstantUnion
                               ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                1.0,EbtFloat,loc,false)->super_TIntermTyped;
          s = 0x1c;
          dst = (TIntermAggregate *)
                TIntermediate::addBinaryMath
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpDiv,
                           recip_w,local_500,loc);
          pTVar13 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,s);
          TIntermAggregate::TIntermAggregate(pTVar13,EOpConstructVec4);
          local_548 = pTVar13;
          iVar4 = (*(pTVar13->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])();
          local_550 = local_4c8;
          std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                    ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                     CONCAT44(extraout_var_11,iVar4),(value_type *)&local_550);
          iVar4 = (*(local_548->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])();
          local_558 = dst;
          std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                    ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                     CONCAT44(extraout_var_12,iVar4),(value_type *)&local_558);
          pTVar13 = local_548;
          TType::TType(&local_5f0,EbtFloat,EvqTemporary,4,0,0,false);
          (*(pTVar13->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1d])(pTVar13,&local_5f0);
          TType::~TType(&local_5f0);
          (*(local_548->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[1])(local_548,loc);
          pos_xyz = (TIntermTyped *)local_548;
        }
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar15 = handleAssign(this,loc,EOpAssign,input,pos_xyz);
        TIntermediate::growAggregate(pTVar1,(TIntermNode *)this_02,&pTVar15->super_TIntermNode);
        __gnu_cxx::
        __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
        ::operator++(&opaqueUniformIt,0);
      }
      iVar4 = (*local_4a8->type->_vptr_TType[10])();
      if (((uint)*(undefined8 *)(CONCAT44(extraout_var_13,iVar4) + 8) & 0x7f) == 5) {
        uVar5 = (*local_4a8->type->_vptr_TType[0x36])();
        pTVar15 = input;
        if ((uVar5 & 1) == 0) {
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar14 = handleVariable(this,loc,local_4a8->name);
          pTVar15 = handleAssign(this,loc,EOpAssign,pTVar15,pTVar14);
          TIntermediate::growAggregate(pTVar1,(TIntermNode *)this_02,&pTVar15->super_TIntermNode);
        }
        else {
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          ppTVar16 = __gnu_cxx::
                     __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                     ::operator*((__normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                                  *)&callingArgs);
          pTVar17 = TIntermediate::addSymbol(pTVar2,*ppTVar16);
          pTVar15 = handleAssign(this,loc,EOpAssign,pTVar15,&pTVar17->super_TIntermTyped);
          TIntermediate::growAggregate(pTVar1,(TIntermNode *)this_02,&pTVar15->super_TIntermNode);
          __gnu_cxx::
          __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
          ::operator++((__normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                        *)&callingArgs);
        }
      }
    }
    pTVar9 = TFunction::getMangledName_abi_cxx11_((TFunction *)&synthParams);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator=(&this->currentCaller,pTVar9);
    pTVar15 = handleFunctionCall(this,loc,(TFunction *)
                                          &argVars.
                                           super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                           .
                                           super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 pTStack_498);
    iVar4 = (*(userFunction->super_TSymbol)._vptr_TSymbol[6])();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator=(&this->currentCaller,
              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              CONCAT44(extraout_var_14,iVar4));
    if (inputs.super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      TIntermediate::growAggregate
                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                 (TIntermNode *)this_02,&pTVar15->super_TIntermNode);
    }
    else {
      if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
        invocationIdType.spirvType = (TSpirvType *)findTessLinkageSymbol(this,EbvInvocationId);
        if ((TIntermSymbol *)invocationIdType.spirvType == (TIntermSymbol *)0x0) {
          TType::TType((TType *)&invocationIdName,EbtUint,EvqIn,1,0,0,false);
          pTVar9 = NewPoolTString_abi_cxx11_("InvocationId");
          pTVar11 = TType::getQualifier((TType *)&invocationIdName);
          *(ulong *)&pTVar11->field_0x8 =
               *(ulong *)&pTVar11->field_0x8 & 0xffffffffffff007f | 0x1980;
          variable_00 = makeInternalVariable(this,pTVar9,(TType *)&invocationIdName);
          iVar4 = (*(variable_00->super_TSymbol)._vptr_TSymbol[0xd])();
          pTVar11 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_15,iVar4) + 0x50))();
          globalQualifierFix(this,loc,pTVar11);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                    (this,variable_00);
          invocationIdType.spirvType =
               (TSpirvType *)
               TIntermediate::addSymbol
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          variable_00);
          TType::~TType((TType *)&invocationIdName);
        }
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        pTVar17 = TIntermediate::addSymbol
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             (TVariable *)
                             inputs.
                             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                             .
                             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pTVar14 = TIntermediate::addIndex
                            (pTVar1,EOpIndexIndirect,&pTVar17->super_TIntermTyped,
                             (TIntermTyped *)invocationIdType.spirvType,loc);
        pTVar18 = (TType *)(**(code **)&((*inputs.
                                           super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                           .
                                           super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->type
                                        ).qualifier.field_0x20)();
        TType::TType((TType *)&outputIt,pTVar18,0,false);
        (*(pTVar14->super_TIntermNode)._vptr_TIntermNode[0x1d])(pTVar14,&outputIt);
        invocationIdSym = (TIntermSymbol *)handleAssign(this,loc,EOpAssign,pTVar14,pTVar15);
        TType::~TType((TType *)&outputIt);
      }
      else {
        pTVar17 = TIntermediate::addSymbol
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             (TVariable *)
                             inputs.
                             super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                             .
                             super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        invocationIdSym =
             (TIntermSymbol *)handleAssign(this,loc,EOpAssign,&pTVar17->super_TIntermTyped,pTVar15);
      }
      TIntermediate::growAggregate
                ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                 (TIntermNode *)this_02,(TIntermNode *)invocationIdSym);
    }
    iStack_760 = std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::
                 begin((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                        *)&makeVariableInOut);
    for (local_768._4_4_ = 0; iVar4 = local_768._4_4_,
        iVar7 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x24])(), iVar4 < iVar7;
        local_768._4_4_ = local_768._4_4_ + 1) {
      iVar4 = (*(userFunction->super_TSymbol)._vptr_TSymbol[0x27])();
      local_770 = (TParameter *)CONCAT44(extraout_var_16,iVar4);
      iVar4 = (*local_770->type->_vptr_TType[10])();
      bVar3 = TQualifier::isParamOutput((TQualifier *)CONCAT44(extraout_var_17,iVar4));
      if (bVar3) {
        TVar6 = TParameter::getDeclaredBuiltIn(local_770);
        if (TVar6 == EbvGsOutputStream) {
          ppTVar16 = __gnu_cxx::
                     __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                     ::operator*(&stack0xfffffffffffff8a0);
          this->gsStreamOutput = *ppTVar16;
        }
        else {
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          ppTVar16 = __gnu_cxx::
                     __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
                     ::operator*(&stack0xfffffffffffff8a0);
          pTVar17 = TIntermediate::addSymbol(pTVar2,*ppTVar16);
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          ppTVar10 = std::
                     vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>::
                     operator[]((vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                 *)&synthBody,(long)local_768._4_4_);
          right = TIntermediate::addSymbol(pTVar2,*ppTVar10);
          pTVar15 = handleAssign(this,loc,EOpAssign,&pTVar17->super_TIntermTyped,
                                 &right->super_TIntermTyped);
          TIntermediate::growAggregate(pTVar1,(TIntermNode *)this_02,&pTVar15->super_TIntermNode);
        }
        synthFunctionDef =
             (TIntermNode *)
             __gnu_cxx::
             __normal_iterator<glslang::TVariable_**,_std::vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>_>
             ::operator++(&stack0xfffffffffffff8a0,0);
      }
    }
    (*(this_02->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
              (this_02,1);
    local_780 = this_01;
    handleFunctionBody(this,loc,(TFunction *)&synthParams,(TIntermNode *)this_02,
                       (TIntermNode **)&local_780);
    this->entryPointFunctionBody = (TIntermNode *)this_02;
    this_local = local_780;
    TVector<glslang::TVariable_*>::~TVector((TVector<glslang::TVariable_*> *)&synthBody);
    TFunction::~TFunction
              ((TFunction *)
               &argVars.
                super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
                super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    TFunction::~TFunction((TFunction *)&synthParams);
    TType::~TType((TType *)&synthEntryPoint.linkType);
    TVector<glslang::TVariable_*>::~TVector((TVector<glslang::TVariable_*> *)local_d8);
    TVector<glslang::TVariable_*>::~TVector((TVector<glslang::TVariable_*> *)&makeVariableInOut);
    TVector<glslang::TVariable_*>::~TVector
              ((TVector<glslang::TVariable_*> *)
               &outputs.
                super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
                super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    remapNonEntryPointIO(this,userFunction);
    this_local = (HlslParseContext *)0x0;
  }
  return (TIntermNode *)this_local;
}

Assistant:

TIntermNode* HlslParseContext::transformEntryPoint(const TSourceLoc& loc, TFunction& userFunction,
                                                   const TAttributes& attributes)
{
    // Return true if this is a tessellation patch constant function input to a domain shader.
    const auto isDsPcfInput = [this](const TType& type) {
        return language == EShLangTessEvaluation &&
        type.contains([](const TType* t) {
                return t->getQualifier().builtIn == EbvTessLevelOuter ||
                       t->getQualifier().builtIn == EbvTessLevelInner;
            });
    };

    // if we aren't in the entry point, fix the IO as such and exit
    if (! isEntrypointName(userFunction.getName())) {
        remapNonEntryPointIO(userFunction);
        return nullptr;
    }

    entryPointFunction = &userFunction; // needed in finish()

    // Handle entry point attributes
    handleEntryPointAttributes(loc, attributes);

    // entry point logic...

    // Move parameters and return value to shader in/out
    TVariable* entryPointOutput; // gets created in remapEntryPointIO
    TVector<TVariable*> inputs;
    TVector<TVariable*> outputs;
    remapEntryPointIO(userFunction, entryPointOutput, inputs, outputs);

    // Further this return/in/out transform by flattening, splitting, and assigning locations
    const auto makeVariableInOut = [&](TVariable& variable) {
        if (variable.getType().isStruct()) {
            bool arrayed = variable.getType().getQualifier().isArrayedIo(language);
            flatten(variable, false /* don't track linkage here, it will be tracked in assignToInterface() */, arrayed);
        }
        // TODO: flatten arrays too
        // TODO: flatten everything in I/O
        // TODO: replace all split with flatten, make all paths can create flattened I/O, then split code can be removed

        // For clip and cull distance, multiple output variables potentially get merged
        // into one in assignClipCullDistance.  That code in assignClipCullDistance
        // handles the interface logic, so we avoid it here in that case.
        if (!isClipOrCullDistance(variable.getType()))
            assignToInterface(variable);
    };
    if (entryPointOutput != nullptr)
        makeVariableInOut(*entryPointOutput);
    for (auto it = inputs.begin(); it != inputs.end(); ++it)
        if (!isDsPcfInput((*it)->getType()))  // wait until the end for PCF input (see comment below)
            makeVariableInOut(*(*it));
    for (auto it = outputs.begin(); it != outputs.end(); ++it)
        makeVariableInOut(*(*it));

    // In the domain shader, PCF input must be at the end of the linkage.  That's because in the
    // hull shader there is no ordering: the output comes from the separate PCF, which does not
    // participate in the argument list.  That is always put at the end of the HS linkage, so the
    // input side of the DS must match.  The argument may be in any position in the DS argument list
    // however, so this ensures the linkage is built in the correct order regardless of argument order.
    if (language == EShLangTessEvaluation) {
        for (auto it = inputs.begin(); it != inputs.end(); ++it)
            if (isDsPcfInput((*it)->getType()))
                makeVariableInOut(*(*it));
    }

    // Add uniform parameters to the $Global uniform block.
    TVector<TVariable*> opaque_uniforms;
    for (int i = 0; i < userFunction.getParamCount(); i++) {
        TType& paramType = *userFunction[i].type;
        TString& paramName = *userFunction[i].name;
        if (paramType.getQualifier().storage == EvqUniform) {
            if (!paramType.containsOpaque()) {
                // Add it to the global uniform block.
                growGlobalUniformBlock(loc, paramType, paramName);
            } else {
                // Declare it as a separate variable.
                TVariable *var = makeInternalVariable(paramName.c_str(), paramType);
                opaque_uniforms.push_back(var);
            }
        }
    }

    // Synthesize the call

    pushScope(); // matches the one in handleFunctionBody()

    // new signature
    TType voidType(EbtVoid);
    TFunction synthEntryPoint(&userFunction.getName(), voidType);
    TIntermAggregate* synthParams = new TIntermAggregate();
    intermediate.setAggregateOperator(synthParams, EOpParameters, voidType, loc);
    intermediate.setEntryPointMangledName(synthEntryPoint.getMangledName().c_str());
    intermediate.incrementEntryPointCount();
    TFunction callee(&userFunction.getName(), voidType); // call based on old name, which is still in the symbol table

    // change original name
    userFunction.addPrefix("@");                         // change the name in the function, but not in the symbol table

    // Copy inputs (shader-in -> calling arg), while building up the call node
    TVector<TVariable*> argVars;
    TIntermAggregate* synthBody = new TIntermAggregate();
    auto inputIt = inputs.begin();
    auto opaqueUniformIt = opaque_uniforms.begin();
    TIntermTyped* callingArgs = nullptr;

    for (int i = 0; i < userFunction.getParamCount(); i++) {
        TParameter& param = userFunction[i];
        argVars.push_back(makeInternalVariable(*param.name, *param.type));
        argVars.back()->getWritableType().getQualifier().makeTemporary();

        // Track the input patch, which is the only non-builtin supported by hull shader PCF.
        if (param.getDeclaredBuiltIn() == EbvInputPatch)
            inputPatch = argVars.back();

        TIntermSymbol* arg = intermediate.addSymbol(*argVars.back());
        handleFunctionArgument(&callee, callingArgs, arg);
        if (param.type->getQualifier().isParamInput()) {
            TIntermTyped* input = intermediate.addSymbol(**inputIt);
            if (input->getType().getQualifier().builtIn == EbvFragCoord && intermediate.getDxPositionW()) {
                // Replace FragCoord W with reciprocal
                auto pos_xyz = handleDotDereference(loc, input, "xyz");
                auto pos_w   = handleDotDereference(loc, input, "w");
                auto one     = intermediate.addConstantUnion(1.0, EbtFloat, loc);
                auto recip_w = intermediate.addBinaryMath(EOpDiv, one, pos_w, loc);
                TIntermAggregate* dst = new TIntermAggregate(EOpConstructVec4);
                dst->getSequence().push_back(pos_xyz);
                dst->getSequence().push_back(recip_w);
                dst->setType(TType(EbtFloat, EvqTemporary, 4));
                dst->setLoc(loc);
                input = dst;
            }
            intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign, arg, input));
            inputIt++;
        }
        if (param.type->getQualifier().storage == EvqUniform) {
            if (!param.type->containsOpaque()) {
                // Look it up in the $Global uniform block.
                intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign, arg,
                                                                   handleVariable(loc, param.name)));
            } else {
                intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign, arg,
                                                                   intermediate.addSymbol(**opaqueUniformIt)));
                ++opaqueUniformIt;
            }
        }
    }

    // Call
    currentCaller = synthEntryPoint.getMangledName();
    TIntermTyped* callReturn = handleFunctionCall(loc, &callee, callingArgs);
    currentCaller = userFunction.getMangledName();

    // Return value
    if (entryPointOutput) {
        TIntermTyped* returnAssign;

        // For hull shaders, the wrapped entry point return value is written to
        // an array element as indexed by invocation ID, which we might have to make up.
        // This is required to match SPIR-V semantics.
        if (language == EShLangTessControl) {
            TIntermSymbol* invocationIdSym = findTessLinkageSymbol(EbvInvocationId);

            // If there is no user declared invocation ID, we must make one.
            if (invocationIdSym == nullptr) {
                TType invocationIdType(EbtUint, EvqIn, 1);
                TString* invocationIdName = NewPoolTString("InvocationId");
                invocationIdType.getQualifier().builtIn = EbvInvocationId;

                TVariable* variable = makeInternalVariable(*invocationIdName, invocationIdType);

                globalQualifierFix(loc, variable->getWritableType().getQualifier());
                trackLinkage(*variable);

                invocationIdSym = intermediate.addSymbol(*variable);
            }

            TIntermTyped* element = intermediate.addIndex(EOpIndexIndirect, intermediate.addSymbol(*entryPointOutput),
                                                          invocationIdSym, loc);

            // Set the type of the array element being dereferenced
            const TType derefElementType(entryPointOutput->getType(), 0);
            element->setType(derefElementType);

            returnAssign = handleAssign(loc, EOpAssign, element, callReturn);
        } else {
            returnAssign = handleAssign(loc, EOpAssign, intermediate.addSymbol(*entryPointOutput), callReturn);
        }
        intermediate.growAggregate(synthBody, returnAssign);
    } else
        intermediate.growAggregate(synthBody, callReturn);

    // Output copies
    auto outputIt = outputs.begin();
    for (int i = 0; i < userFunction.getParamCount(); i++) {
        TParameter& param = userFunction[i];

        // GS outputs are via emit, so we do not copy them here.
        if (param.type->getQualifier().isParamOutput()) {
            if (param.getDeclaredBuiltIn() == EbvGsOutputStream) {
                // GS output stream does not assign outputs here: it's the Append() method
                // which writes to the output, probably multiple times separated by Emit.
                // We merely remember the output to use, here.
                gsStreamOutput = *outputIt;
            } else {
                intermediate.growAggregate(synthBody, handleAssign(loc, EOpAssign,
                                                                   intermediate.addSymbol(**outputIt),
                                                                   intermediate.addSymbol(*argVars[i])));
            }

            outputIt++;
        }
    }

    // Put the pieces together to form a full function subtree
    // for the synthesized entry point.
    synthBody->setOperator(EOpSequence);
    TIntermNode* synthFunctionDef = synthParams;
    handleFunctionBody(loc, synthEntryPoint, synthBody, synthFunctionDef);

    entryPointFunctionBody = synthBody;

    return synthFunctionDef;
}